

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int l_strton(TValue *obj,TValue *result)

{
  lua_CFunction p_Var1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  code *s;
  
  uVar2 = 0;
  if ((obj->tt_ & 0xf) == 4) {
    p_Var1 = (obj->value_).f;
    lVar4 = (long)(char)p_Var1[0xb];
    if (lVar4 < 0) {
      lVar4 = *(long *)(p_Var1 + 0x10);
      s = *(code **)(p_Var1 + 0x18);
    }
    else {
      s = p_Var1 + 0x18;
    }
    sVar3 = luaO_str2num((char *)s,result);
    uVar2 = (uint)(sVar3 == lVar4 + 1U);
  }
  return uVar2;
}

Assistant:

static int l_strton (const TValue *obj, TValue *result) {
  lua_assert(obj != result);
  if (!cvt2num(obj))  /* is object not a string? */
    return 0;
  else {
    TString *st = tsvalue(obj);
    size_t stlen;
    const char *s = getlstr(st, stlen);
    return (luaO_str2num(s, result) == stlen + 1);
  }
}